

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O3

void __thiscall
TPZMHMixedMeshControl::InsertPeriferalPressureMaterialObjects(TPZMHMixedMeshControl *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color id;
  int iVar3;
  TPZCompMesh *this_00;
  _Base_ptr p_Var4;
  TPZNullMaterial<double> *pTVar5;
  _Base_ptr p_Var6;
  TPZMaterial *pTVar7;
  _Base_ptr p_Var8;
  _Self __tmp;
  
  p_Var6 = (this->super_TPZMHMeshControl).fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_left;
  p_Var1 = &(this->super_TPZMHMeshControl).fMaterialIds._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    this_00 = ((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer;
    p_Var2 = &(this_00->fMaterialVec)._M_t._M_impl.super__Rb_tree_header;
    do {
      id = p_Var6[1]._M_color;
      p_Var4 = (this_00->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var8 = &p_Var2->_M_header;
      if (p_Var4 != (_Base_ptr)0x0) {
        do {
          if ((int)id <= (int)p_Var4[1]._M_color) {
            p_Var8 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < (int)id];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var8 != p_Var2) && ((int)p_Var8[1]._M_color <= (int)id)) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                     ,0x1ee);
        }
      }
      pTVar5 = (TPZNullMaterial<double> *)operator_new(0x50);
      *(undefined ***)
       &(pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).super_TPZMaterialT<double>.
        super_TPZMaterial = &PTR__TPZSavable_018c8710;
      TPZMatBase<double,_TPZMatSingleSpaceT<double>_>::TPZMatBase
                ((TPZMatBase<double,_TPZMatSingleSpaceT<double>_> *)pTVar5,&PTR_PTR_018c7c38,id);
      *(undefined ***)
       &(pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).super_TPZMaterialT<double>.
        super_TPZMaterial = &PTR__TPZNullMaterial_018c7a58;
      (pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).
      super_TPZMatSingleSpaceT<double>.super_TPZMatSingleSpace =
           (TPZMatSingleSpace)&PTR__TPZNullMaterial_018c7ba0;
      pTVar5->fDim = 1;
      pTVar5->fNState = (this->super_TPZMHMeshControl).fNState;
      TPZNullMaterial<double>::SetDimension
                (pTVar5,((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fDim);
      TPZCompMesh::InsertMaterialObject(this_00,(TPZMaterial *)pTVar5);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  iVar3 = (this->super_TPZMHMeshControl).fPressureSkeletonMatId;
  if (iVar3 == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
               ,0x1fd);
  }
  pTVar7 = TPZCompMesh::FindMaterial
                     (((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer,iVar3);
  if (pTVar7 == (TPZMaterial *)0x0) {
    pTVar5 = (TPZNullMaterial<double> *)operator_new(0x50);
    iVar3 = (this->super_TPZMHMeshControl).fPressureSkeletonMatId;
    *(undefined ***)
     &(pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).super_TPZMaterialT<double>.
      super_TPZMaterial = &PTR__TPZSavable_018c8710;
    TPZMatBase<double,_TPZMatSingleSpaceT<double>_>::TPZMatBase
              ((TPZMatBase<double,_TPZMatSingleSpaceT<double>_> *)pTVar5,&PTR_PTR_018c7c38,iVar3);
    *(undefined ***)
     &(pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).super_TPZMaterialT<double>.
      super_TPZMaterial = &PTR__TPZNullMaterial_018c7a58;
    (pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).super_TPZMatSingleSpaceT<double>
    .super_TPZMatSingleSpace = (TPZMatSingleSpace)&PTR__TPZNullMaterial_018c7ba0;
    pTVar5->fDim = 1;
    pTVar5->fNState = 1;
    TPZNullMaterial<double>::SetDimension
              (pTVar5,((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fDim + -1);
    pTVar5->fNState = (this->super_TPZMHMeshControl).fNState;
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
             ,500);
}

Assistant:

void TPZMHMixedMeshControl::InsertPeriferalPressureMaterialObjects()
{
    TPZCompMesh * cmeshPressure = fPressureFineMesh.operator->();
    
    
    for (auto it = fMaterialIds.begin(); it != fMaterialIds.end(); it++)
    {
        int matid = *it;
        if (cmeshPressure->MaterialVec().find(matid) == cmeshPressure->MaterialVec().end())
        {
            auto *matl2 = new TPZNullMaterial<STATE>((matid));
            matl2->SetNStateVariables(fNState);
            matl2->SetDimension(fGMesh->Dimension());
            cmeshPressure->InsertMaterialObject(matl2);
        }
        else
        {
            DebugStop();
        }
    }
    if(fPressureSkeletonMatId != 0)
    {
        if (fPressureFineMesh->FindMaterial(fPressureSkeletonMatId) != 0) {
            DebugStop();
        }
        auto *mathybrid = new TPZNullMaterial<STATE>(fPressureSkeletonMatId);
        mathybrid->SetDimension(fGMesh->Dimension()-1);
        mathybrid->SetNStateVariables(fNState);
        //fPressureFineMesh->InsertMaterialObject(mathybrid);
    }
    else
    {
        DebugStop();
    }

}